

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::anon_unknown_5::
GenericFind<absl::lts_20250127::(anonymous_namespace)::AnyOfPolicy>
          (anon_unknown_5 *this,size_t param_2,size_t param_3,size_t param_4,size_t param_5)

{
  string_view sVar1;
  string_view delimiter;
  string_view text;
  string_view sVar2;
  bool bVar3;
  const_pointer pvVar4;
  size_type sVar5;
  char *__str;
  size_t __len;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_t local_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  size_t local_50;
  size_t found_pos;
  size_t pos_local;
  undefined1 local_38 [8];
  string_view delimiter_local;
  string_view text_local;
  string_view found;
  
  found_pos = param_5;
  local_38 = (undefined1  [8])param_3;
  delimiter_local._M_len = param_4;
  delimiter_local._M_str = (char *)this;
  text_local._M_len = param_2;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  if ((bVar3) &&
     (sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str
                        ), sVar5 != 0)) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str,
               pvVar4 + found_pos + 1,0);
  }
  else {
    local_50 = 0xffffffffffffffff;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str)
    ;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str,pvVar4 + sVar5
               ,0);
    local_60 = delimiter_local._M_str;
    local_58 = text_local._M_len;
    local_70 = (size_t)local_38;
    local_68 = delimiter_local._M_len;
    text._M_str = (char *)text_local._M_len;
    text._M_len = (size_t)delimiter_local._M_str;
    delimiter._M_str = (char *)delimiter_local._M_len;
    delimiter._M_len = (size_t)local_38;
    local_50 = AnyOfPolicy::Find(text,delimiter,found_pos);
    if (local_50 != 0xffffffffffffffff) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &delimiter_local._M_str);
      __str = pvVar4 + local_50;
      sVar1._M_str = (char *)delimiter_local._M_len;
      sVar1._M_len = (size_t)local_38;
      __len = AnyOfPolicy::Length(sVar1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_80,__str,__len);
      text_local._M_str = (char *)local_80._M_len;
      found._M_len = (size_t)local_80._M_str;
    }
  }
  sVar2._M_str = (char *)found._M_len;
  sVar2._M_len = (size_t)text_local._M_str;
  return sVar2;
}

Assistant:

absl::string_view GenericFind(absl::string_view text,
                              absl::string_view delimiter, size_t pos,
                              FindPolicy find_policy) {
  if (delimiter.empty() && text.length() > 0) {
    // Special case for empty string delimiters: always return a zero-length
    // absl::string_view referring to the item at position 1 past pos.
    return absl::string_view(text.data() + pos + 1, 0);
  }
  size_t found_pos = absl::string_view::npos;
  absl::string_view found(text.data() + text.size(),
                          0);  // By default, not found
  found_pos = find_policy.Find(text, delimiter, pos);
  if (found_pos != absl::string_view::npos) {
    found = absl::string_view(text.data() + found_pos,
                              find_policy.Length(delimiter));
  }
  return found;
}